

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioWaveGetHighPulses(void)

{
  FILE *pFVar1;
  char *pcVar2;
  uint32_t local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: \n",pcVar2,"gpioWaveGetHighPulses");
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,
              "gpioWaveGetHighPulses");
    }
    local_4 = 0xffffffe1;
  }
  else {
    local_4 = wfStats.highPulses;
  }
  return local_4;
}

Assistant:

int gpioWaveGetHighPulses(void)
{
   DBG(DBG_USER, "");

   CHECK_INITED;

   return wfStats.highPulses;
}